

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

FunctionData *
anon_unknown.dwarf_9fd58::ImplementPrototype(ExpressionContext *ctx,FunctionData *function)

{
  FunctionData *pFVar1;
  bool bVar2;
  uint hash;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  ScopeData *pSVar6;
  NodeIterator NVar7;
  
  pSVar6 = ctx->scope;
  if ((pSVar6->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
    pSVar6 = ctx->globalScope;
  }
  hash = NULLC::GetStringHash((function->name->name).begin,(function->name->name).end);
  NVar7 = DirectChainedMap<IdentifierLookupResult>::first(&pSVar6->idLookupMap,hash);
  if (NVar7.node != (Node *)0x0) {
    do {
      pNVar4 = NVar7.node;
      pNVar3 = NVar7.start;
      if (pNVar4 == (Node *)0x0) break;
      pFVar1 = *(FunctionData **)(pNVar4 + 0x10);
      if (((pFVar1 == function || pFVar1 == (FunctionData *)0x0) || (pFVar1->isPrototype != true))
         || (pFVar1->type != function->type)) {
        pNVar5 = *(Node **)(pNVar4 + 0x18);
        bVar2 = true;
        if (pNVar5 != pNVar3) {
          do {
            if (pNVar5 == (Node *)0x0) break;
            if (*(int *)pNVar5 == *(int *)pNVar4) {
              NVar7.node = pNVar5;
              NVar7.start = pNVar3;
              goto LAB_0016bb98;
            }
            pNVar5 = *(Node **)(pNVar5 + 0x18);
          } while (pNVar5 != pNVar3);
        }
        NVar7 = (NodeIterator)ZEXT816(0);
      }
      else {
        bVar2 = false;
      }
LAB_0016bb98:
      pNVar4 = NVar7.node;
    } while (bVar2);
    if (pNVar4 != (Node *)0x0) {
      pFVar1 = *(FunctionData **)(pNVar4 + 0x10);
      pFVar1->implementation = function;
      ExpressionContext::HideFunction(ctx,pFVar1);
      return pFVar1;
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ImplementPrototype(ExpressionContext &ctx, FunctionData *function)
	{
		ScopeData *lookupScope = ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE ? ctx.globalScope : ctx.scope;

		if(DirectChainedMap<IdentifierLookupResult>::NodeIterator curr = lookupScope->idLookupMap.first(function->name->name.hash()))
		{
			while(curr)
			{
				FunctionData *option = curr.node->value.function;

				if(option && option != function && option->isPrototype && option->type == function->type)
					break;

				curr = ctx.scope->idLookupMap.next(curr);
			}

			if(curr)
			{
				FunctionData *prototype = curr.node->value.function;

				prototype->implementation = function;

				ctx.HideFunction(prototype);

				return prototype;
			}
		}

		return NULL;
	}